

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

InstanceSymbol *
slang::ast::InstanceSymbol::createInvalid(Compilation *compilation,DefinitionSymbol *definition)

{
  InstanceSymbol *pIVar1;
  BumpAllocator *in_RSI;
  InstanceBodySymbol *in_RDI;
  ConfigBlockSymbol *in_stack_000001b8;
  HierarchyOverrideNode *in_stack_000001c0;
  DefinitionSymbol *in_stack_000001c8;
  Compilation *in_stack_000001d0;
  bitmask<slang::ast::InstanceFlags> in_stack_000001df;
  SourceLocation in_stack_000001e0;
  ConfigRule *in_stack_000001f0;
  SourceLocation *in_stack_ffffffffffffffe0;
  char (*args) [1];
  
  args = (char (*) [1])in_RSI[1].endPtr;
  bitmask<slang::ast::InstanceFlags>::bitmask
            ((bitmask<slang::ast::InstanceFlags> *)&stack0xffffffffffffffe7,Uninstantiated);
  InstanceBodySymbol::fromDefinition
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001e0,in_stack_000001df,
             in_stack_000001c0,in_stack_000001b8,in_stack_000001f0);
  pIVar1 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,char_const(&)[1],slang::SourceLocation_const&,slang::ast::InstanceBodySymbol&>
                     (in_RSI,args,in_stack_ffffffffffffffe0,in_RDI);
  return pIVar1;
}

Assistant:

InstanceSymbol& InstanceSymbol::createInvalid(Compilation& compilation,
                                              const DefinitionSymbol& definition) {
    // Give this instance an empty name so that it can't be referenced by name.
    return *compilation.emplace<InstanceSymbol>(
        "", SourceLocation::NoLocation,
        InstanceBodySymbol::fromDefinition(compilation, definition, definition.location,
                                           InstanceFlags::Uninstantiated, nullptr, nullptr,
                                           nullptr));
}